

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text,size_t len)

{
  char *__dest;
  undefined8 extraout_RAX;
  size_t __n;
  ostringstream oss;
  string local_1b8;
  string local_198 [3];
  ios_base local_128 [264];
  
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
    this->comment_ = (char *)0x0;
  }
  if (text == (char *)0x0) {
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"assert json failed","");
    throwLogicError(local_198);
  }
  else {
    if ((*text != '\0') && (*text != '/')) goto LAB_0011a07e;
    __n = 0x7ffffffe;
    if (len < 0x7ffffffe) {
      __n = len;
    }
    __dest = (char *)malloc(__n + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,text,__n);
      __dest[__n] = '\0';
      this->comment_ = __dest;
      return;
    }
  }
  local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer","");
  throwRuntimeError(local_198);
LAB_0011a07e:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"in Json::Value::setComment(): Comments must start with /",0x38);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Value::CommentInfo::setComment(const char* text, size_t len) {
  if (comment_) {
    releaseStringValue(comment_);
    comment_ = 0;
  }
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text, len);
}